

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O2

int If_ManImproveNodeWillGrow(If_Man_t *p,If_Obj_t *pObj)

{
  uint uVar1;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) == (undefined1  [112])0x4) {
    uVar1 = 0;
    if ((pObj->pFanin0->field_0x1 & 1) == 0) {
      uVar1 = (uint)((pObj->pFanin1->field_0x1 & 1) == 0);
    }
    return uVar1;
  }
  __assert_fail("If_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                ,0x10d,"int If_ManImproveNodeWillGrow(If_Man_t *, If_Obj_t *)");
}

Assistant:

static inline If_Obj_t * If_ObjFanin0( If_Obj_t * pObj )                     { return pObj->pFanin0;                 }